

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeNonAtomicLoad(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  Name memory;
  int8_t iVar2;
  byte bVar3;
  Index IVar4;
  BasicType BVar5;
  uint32_t uVar6;
  uint align;
  Type ptr;
  Load *pLVar7;
  uint bytes;
  Address offset;
  Type this_01;
  bool signed_;
  size_t sVar8;
  char *pcVar9;
  Type local_40;
  Type type_local;
  
  this_00 = &this->random;
  local_40.id = type.id;
  iVar2 = Random::get(this_00);
  IVar4 = logify(this,(int)iVar2);
  ptr.id = (uintptr_t)makePointer(this);
  BVar5 = Type::getBasic(&local_40);
  switch(BVar5) {
  case none:
  case unreachable:
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xb7c);
  case i32:
    bVar3 = Random::get(this_00);
    uVar6 = Random::upTo(this_00,3);
    if (uVar6 == 2) {
switchD_00157528_caseD_2:
      signed_ = (bool)(bVar3 & 1);
      type_local.id = (uintptr_t)&this->builder;
      bytes = 4;
      align = Random::pick<int,int,int>(this_00,1,2,4);
      goto LAB_00157669;
    }
    if (uVar6 == 1) goto switchD_00157528_caseD_1;
    if (uVar6 != 0) {
      wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xb48);
    }
switchD_00157528_caseD_0:
    signed_ = (bool)(bVar3 & 1);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    sVar8 = *(size_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcVar9 = *(char **)((long)_Var1.
                              super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                              .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    bytes = 1;
    this_01.id = (uintptr_t)&this->builder;
    align = bytes;
    goto LAB_00157697;
  case i64:
    bVar3 = Random::get(this_00);
    uVar6 = Random::upTo(this_00,4);
    switch(uVar6) {
    case 0:
      goto switchD_00157528_caseD_0;
    case 1:
switchD_00157528_caseD_1:
      signed_ = (bool)(bVar3 & 1);
      type_local.id = (uintptr_t)&this->builder;
      bytes = 2;
      align = Random::pick<int,int>(this_00,1,2);
      break;
    case 2:
      goto switchD_00157528_caseD_2;
    case 3:
      signed_ = (bool)(bVar3 & 1);
      type_local.id = (uintptr_t)&this->builder;
      bytes = 8;
      align = Random::pick<int,int,int,int>(this_00,1,2,4,8);
      break;
    default:
      wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xb64);
    }
LAB_00157669:
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    sVar8 = *(size_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcVar9 = *(char **)((long)_Var1.
                              super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                              .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    this_01.id = type_local.id;
    goto LAB_00157697;
  case f32:
    bytes = 4;
    align = Random::pick<int,int,int>(this_00,1,2,4);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    sVar8 = *(size_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcVar9 = *(char **)((long)_Var1.
                              super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                              .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    signed_ = false;
    this_01.id = (uintptr_t)&this->builder;
    goto LAB_00157697;
  case f64:
    bytes = 8;
    type_local.id = ptr.id;
    align = Random::pick<int,int,int,int>(this_00,1,2,4,8);
    break;
  case v128:
    if (((this->wasm->features).features & 8) == 0) {
      pLVar7 = (Load *)makeTrivial(this,local_40);
      return (Expression *)pLVar7;
    }
    bytes = 0x10;
    type_local.id = ptr.id;
    align = Random::pick<int,int,int,int,int>(this_00,1,2,4,8,0x10);
    break;
  default:
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xb7e);
  }
  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (((this->wasm->memories).
         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
  sVar8 = *(size_t *)
           _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  pcVar9 = *(char **)((long)_Var1.
                            super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
  signed_ = false;
  this_01.id = (uintptr_t)&this->builder;
  ptr.id = type_local.id;
LAB_00157697:
  offset.addr._4_4_ = 0;
  offset.addr._0_4_ = IVar4;
  memory.super_IString.str._M_str = pcVar9;
  memory.super_IString.str._M_len = sVar8;
  pLVar7 = Builder::makeLoad((Builder *)this_01.id,bytes,signed_,offset,align,(Expression *)ptr.id,
                             local_40,memory);
  return (Expression *)pLVar7;
}

Assistant:

Expression* TranslateToFuzzReader::makeNonAtomicLoad(Type type) {
  auto offset = logify(get());
  auto ptr = makePointer();
  switch (type.getBasic()) {
    case Type::i32: {
      bool signed_ = get() & 1;
      switch (upTo(3)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::i64: {
      bool signed_ = get() & 1;
      switch (upTo(4)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
        case 3:
          return builder.makeLoad(8,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4, 8),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::f32: {
      return builder.makeLoad(
        4, false, offset, pick(1, 2, 4), ptr, type, wasm.memories[0]->name);
    }
    case Type::f64: {
      return builder.makeLoad(
        8, false, offset, pick(1, 2, 4, 8), ptr, type, wasm.memories[0]->name);
    }
    case Type::v128: {
      if (!wasm.features.hasSIMD()) {
        return makeTrivial(type);
      }
      return builder.makeLoad(16,
                              false,
                              offset,
                              pick(1, 2, 4, 8, 16),
                              ptr,
                              type,
                              wasm.memories[0]->name);
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}